

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_alsa.c
# Opt level: O2

void stream_buffer_decrement(cubeb_stream_conflict1 *stm,long count)

{
  char *pcVar1;
  char *__dest;
  ssize_t sVar2;
  size_t __n;
  
  pcVar1 = stm->buffer;
  sVar2 = (*cubeb_snd_pcm_frames_to_bytes)(stm->pcm,count);
  __dest = stm->buffer;
  __n = (*cubeb_snd_pcm_frames_to_bytes)(stm->pcm,stm->bufframes - count);
  memmove(__dest,pcVar1 + sVar2,__n);
  stm->bufframes = stm->bufframes - count;
  return;
}

Assistant:

static void
stream_buffer_decrement(cubeb_stream * stm, long count)
{
  char * bufremains =
      stm->buffer + WRAP(snd_pcm_frames_to_bytes)(stm->pcm, count);
  memmove(stm->buffer, bufremains,
          WRAP(snd_pcm_frames_to_bytes)(stm->pcm, stm->bufframes - count));
  stm->bufframes -= count;
}